

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O0

char * cutToWhiteSpace(char *s,uint offset,char *sbuf)

{
  uint uVar1;
  size_t sVar2;
  bool bVar3;
  uint local_34;
  uint local_30;
  uint n;
  uint l;
  uint j;
  char *sbuf_local;
  uint offset_local;
  char *s_local;
  
  if (s == (char *)0x0) {
    *sbuf = '\0';
    s_local = (char *)0x0;
  }
  else {
    sVar2 = strlen(s);
    if (offset < sVar2) {
      n = 0;
      while( true ) {
        bVar3 = false;
        if (n < offset) {
          bVar3 = s[n] != '\n';
        }
        if (!bVar3) break;
        n = n + 1;
      }
      uVar1 = offset;
      if (n == offset) {
        while( true ) {
          n = uVar1;
          bVar3 = false;
          if (n != 0) {
            bVar3 = s[n] != ' ';
          }
          if (!bVar3) break;
          uVar1 = n - 1;
        }
        local_30 = n;
        local_34 = n + 1;
        if (n == 0) {
          local_34 = offset;
          local_30 = offset;
        }
      }
      else {
        local_30 = n;
        local_34 = n + 1;
      }
      strncpy(sbuf,s,(ulong)local_30);
      sbuf[local_30] = '\0';
      s_local = s + local_34;
    }
    else {
      strcpy(sbuf,s);
      sbuf[offset] = '\0';
      s_local = (char *)0x0;
    }
  }
  return s_local;
}

Assistant:

static const char *cutToWhiteSpace(const char *s, /**< starting point of desired string to output */
                                   uint offset,   /**< column width desired */
                                   char *sbuf     /**< the buffer to output */
                                   )
{
    if (!s)
    {
        sbuf[0] = '\0';
        return NULL;
    }
    else if (strlen(s) <= offset)
    {
        strcpy(sbuf,s);
        sbuf[offset] = '\0';
        return NULL;
    }
    else
    {
        uint j, l, n;
        /* scan forward looking for newline */
        j = 0;
        while(j < offset && s[j] != '\n')
            ++j;
        if ( j == offset ) {
            /* scan backward looking for first space */
            j = offset;
            while(j && s[j] != ' ')
                --j;
            l = j;
            n = j+1;
            /* no white space */
            if (j==0)
            {
                l = offset;
                n = offset;
            }
        } else
        {
            l = j;
            n = j+1;
        }
        strncpy(sbuf,s,l);
        sbuf[l] = '\0';
        return s+n;
    }
}